

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContinuumElastic::ChContinuumElastic
          (ChContinuumElastic *this,double myoung,double mpoisson,double mdensity)

{
  (this->super_ChContinuumMaterial).density = mdensity;
  (this->super_ChContinuumMaterial)._vptr_ChContinuumMaterial =
       (_func_int **)&PTR__ChContinuumElastic_01172930;
  (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  m_storage.m_rows = 0;
  this->E = myoung;
  Set_v(this,mpoisson);
  ComputeStressStrainMatrix(this);
  this->damping_M = 0.0;
  this->damping_K = 0.0;
  return;
}

Assistant:

ChContinuumElastic::ChContinuumElastic(double myoung, double mpoisson, double mdensity)
    : ChContinuumMaterial(mdensity) {
    E = myoung;
    Set_v(mpoisson);              // sets also G and l
    ComputeStressStrainMatrix();  // sets Elasticity matrix
    this->damping_M = 0;
    this->damping_K = 0;
}